

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.hpp
# Opt level: O1

UniformBuffBindInfo * __thiscall
Diligent::ShaderVariableManagerGL::
GetResource<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo>
          (ShaderVariableManagerGL *this,Uint32 ResIndex)

{
  uint uVar1;
  string msg;
  string local_30;
  
  uVar1 = this->m_TextureOffset / 0x18;
  if (uVar1 <= ResIndex) {
    FormatString<char[17],unsigned_int,char[30],unsigned_int,char[2]>
              (&local_30,(Diligent *)"Resource index (",(char (*) [17])&stack0xffffffffffffffc8,
               (uint *)") exceeds max allowed value (",(char (*) [30])&stack0xffffffffffffffcc,
               (uint *)0x930f15,(char (*) [2])CONCAT44(uVar1 - 1,ResIndex));
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderVariableManagerGL.hpp"
               ,0xf9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return (UniformBuffBindInfo *)
         ((ulong)ResIndex * 0x18 +
         (long)(this->super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).
               m_pVariables);
}

Assistant:

ResourceType& GetResource(Uint32 ResIndex) const
    {
        VERIFY(ResIndex < GetNumResources<ResourceType>(), "Resource index (", ResIndex, ") exceeds max allowed value (", GetNumResources<ResourceType>() - 1, ")");
        auto Offset = GetResourceOffset<ResourceType>();
        return reinterpret_cast<ResourceType*>(reinterpret_cast<Uint8*>(m_pVariables) + Offset)[ResIndex];
    }